

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

bool BASELINE::baseline_enabled(example *ec)

{
  bool bVar1;
  features_value_index_iterator *this;
  long *plVar2;
  feature_value *pfVar3;
  int __c;
  features_value_iterator *rhs;
  features_value_index_iterator *f;
  iterator __end1;
  iterator __begin1;
  features *__range1;
  features *fs;
  features_value_iterator in_stack_ffffffffffffffc0;
  features_value_iterator local_30;
  features *in_stack_ffffffffffffffd8;
  
  features::begin(in_stack_ffffffffffffffd8);
  features::end(in_stack_ffffffffffffffd8);
  while( true ) {
    rhs = (features_value_iterator *)&stack0xffffffffffffffc0;
    bVar1 = features_value_iterator::operator!=(&local_30,rhs);
    if (!bVar1) {
      return false;
    }
    this = features_value_index_iterator::operator*((features_value_index_iterator *)&local_30);
    plVar2 = (long *)features_value_index_iterator::index(this,(char *)rhs,__c);
    if (*plVar2 == 0x54d) break;
    features_value_index_iterator::operator++
              ((features_value_index_iterator *)in_stack_ffffffffffffffc0._begin);
  }
  pfVar3 = features_value_iterator::value(&this->super_features_value_iterator);
  return *pfVar3 == 1.0;
}

Assistant:

bool baseline_enabled(example* ec)
{
  auto& fs = ec->feature_space[message_namespace];
  for (auto& f : fs)
  {
    if (f.index() == baseline_enabled_idx)
      return f.value() == 1;
  }
  return false;
}